

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O2

void __thiscall
ConfidentialNonce_Constractor_sizeerr_Test::TestBody
          (ConfidentialNonce_Constractor_sizeerr_Test *this)

{
  bool bVar1;
  allocator local_59;
  AssertHelper local_58 [4];
  ConfidentialNonce nonce;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)local_58,"001122",&local_59);
    cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce);
  }
  testing::Message::Message((Message *)&nonce);
  testing::internal::AssertHelper::AssertHelper
            (local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
             ,0x44,
             "Expected: ConfidentialNonce nonce(\"001122\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_58,(Message *)&nonce);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&nonce);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_sizeerr) {
  // error
  EXPECT_THROW(ConfidentialNonce nonce("001122"), CfdException);
}